

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int mmi_ci_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  s3arc_s *psVar1;
  model_inventory_t *pmVar2;
  int32 iVar3;
  vector_t **pppfVar4;
  ulong uVar5;
  state_t *psVar6;
  ulong uVar7;
  uint uVar8;
  uint32 n_state;
  ulong local_68;
  uint32 local_5c;
  model_inventory_t *local_58;
  model_def_t *local_50;
  lexicon_t *local_48;
  float64 local_40;
  float64 log_lik;
  
  n_state = 0;
  local_5c = mean_reest;
  local_58 = inv;
  local_50 = mdef;
  local_48 = lex;
  local_40 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  pmVar2 = local_58;
  uVar7 = 0;
  while (uVar7 < lat->n_arcs) {
    uVar8 = (lat->arc[uVar7].ef - lat->arc[uVar7].sf) + 1;
    local_68 = uVar7;
    pppfVar4 = (vector_t **)
               __ckd_calloc__((ulong)uVar8,8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                              ,0x5a3);
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      pppfVar4[uVar5] = f[(lat->arc[uVar7].sf + (int)uVar5) - 1];
    }
    psVar6 = next_utt_states(&n_state,local_48,pmVar2,local_50,lat->arc[uVar7].word);
    iVar3 = mmi_viterbi_run(&log_lik,pppfVar4,uVar8,psVar6,n_state,pmVar2,local_40);
    if (iVar3 == 0) {
      psVar1 = lat->arc;
      psVar1[uVar7].good_arc = 1;
      psVar1[uVar7].ac_score = log_lik;
    }
    ckd_free(pppfVar4);
    uVar5 = local_68;
    if (lat->arc[uVar7].good_arc == 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
              ,0x5b7,"arc_%d is ignored (viterbi run failed)\n",(ulong)((int)local_68 + 1));
    }
    uVar7 = uVar5 + 1;
  }
  lat_fwd_bwd(lat);
  pmVar2 = local_58;
  for (uVar7 = 0; uVar7 < lat->n_arcs; uVar7 = uVar7 + 1) {
    psVar1 = lat->arc;
    if (psVar1[uVar7].good_arc == 1) {
      uVar8 = (psVar1[uVar7].ef - psVar1[uVar7].sf) + 1;
      local_68 = uVar7;
      pppfVar4 = (vector_t **)
                 __ckd_calloc__((ulong)uVar8,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                ,0x5c6);
      for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
        pppfVar4[uVar5] = f[(lat->arc[uVar7].sf + (int)uVar5) - 1];
      }
      psVar6 = next_utt_states(&n_state,local_48,pmVar2,local_50,lat->arc[uVar7].word);
      iVar3 = mmi_viterbi_update(pppfVar4,uVar8,psVar6,n_state,pmVar2,local_40,local_5c,var_reest,
                                 lat->arc[uVar7].gamma,fcb);
      uVar7 = local_68;
      if (iVar3 != 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x5d6,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)local_68 + 1));
      }
      ckd_free(pppfVar4);
    }
  }
  return 0;
}

Assistant:

int
mmi_ci_train(model_inventory_t *inv,
	     model_def_t *mdef,
	     lexicon_t *lex,
	     vector_t **f,
	     s3lattice_t *lat,
	     float64 a_beam,
	     uint32 mean_reest,
	     uint32 var_reest,
	     feat_t *fcb)
{
  uint32 k, n;
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);

  for(n=0; n<lat->n_arcs; n++) {
    
    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* make state list */
    state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
    
    /* viterbi compuation to get the acoustic score for a word hypothesis */
    if (mmi_viterbi_run(&log_lik,
			arc_f, n_word_obs,
			state_seq, n_state,
			inv,
			a_beam) == S3_SUCCESS) {
      lat->arc[n].good_arc = 1;
      lat->arc[n].ac_score = log_lik;
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }
  
  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);
  
  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* make state list */
      state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      
      ckd_free(arc_f);
    }
  }
  
  return S3_SUCCESS;
}